

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O2

void __thiscall wasm::RemoveNonJSOpsPass::doWalkModule(RemoveNonJSOpsPass *this,Module *module)

{
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *this_00;
  Index *this_01;
  list<std::pair<wasm::Name,_wasm::Type>,_std::allocator<std::pair<wasm::Name,_wasm::Type>_>_>
  *plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _List_node_base *p_Var4;
  char *pcVar5;
  _Head_base<0UL,_wasm::Global_*,_false> curr;
  pointer __p;
  pointer __p_00;
  Element *module_00;
  Function *pFVar6;
  _Base_ptr p_Var7;
  Global *pGVar8;
  ulong in_RCX;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *in_R8;
  _List_node_base *p_Var9;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  long *plVar10;
  pointer puVar11;
  undefined1 local_698 [8];
  SExpressionWasmBuilder builder;
  Module intrinsicsModule;
  SExpressionParser parser;
  string input;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> neededFunctions;
  _Head_base<0UL,_wasm::Global_*,_false> local_38;
  __single_object global_1;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_RCX;
  ABI::wasm2js::ensureHelpers((wasm2js *)module,(Module *)0x0,(IString)(auVar2 << 0x40));
  if ((this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
      ._M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl == (Builder *)0x0) {
    __p_00 = (pointer)operator_new(8);
    __p_00->wasm = module;
    builder.nameMapper.otherIndex = 0;
    builder.nameMapper._124_4_ = 0;
    std::__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>::reset
              ((__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_> *)&this->builder
               ,__p_00);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::~unique_ptr
              ((unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)
               &builder.nameMapper.otherIndex);
  }
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::doWalkModule
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,module);
  if ((this->neededIntrinsics)._M_h._M_element_count != 0) {
    Module::Module((Module *)&builder.nameMapper.otherIndex);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parser.root,IntrinsicsModuleWast,(allocator<char> *)local_698);
    SExpressionParser::SExpressionParser
              ((SExpressionParser *)&intrinsicsModule.tagsMap._M_h._M_single_bucket,
               &(parser.root)->isList_);
    module_00 = Element::operator[]((Element *)parser.allocator.next._M_b._M_p,0);
    SExpressionWasmBuilder::SExpressionWasmBuilder
              ((SExpressionWasmBuilder *)local_698,(Module *)&builder.nameMapper.otherIndex,
               module_00,Normal);
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&neededFunctions;
    neededFunctions._M_t._M_impl._0_4_ = 0;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&(this->neededIntrinsics)._M_h._M_before_begin;
    this_00 = (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)((long)&input.field_2 + 8);
    this_01 = &builder.nameMapper.otherIndex;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    while (puVar11 = intrinsicsModule.functions.
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
          plVar10 = (long *)neededFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count,
          (this->neededIntrinsics)._M_h._M_element_count != 0) {
      while (plVar10 = (long *)*plVar10, plVar10 != (long *)0x0) {
        in_R8 = this_00;
        addNeededFunctions(this,(Module *)this_01,(Name)((IString *)(plVar10 + 1))->str,
                           (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                           this_00);
      }
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&(this->neededIntrinsics)._M_h);
      for (p_Var7 = neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var7 != (_Rb_tree_node_base *)&neededFunctions;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        pFVar6 = Module::getFunctionOrNull(module,(Name)*(string_view *)(p_Var7 + 1));
        if (pFVar6 == (Function *)0x0) {
          pFVar6 = Module::getFunction((Module *)this_01,(Name)*(string_view *)(p_Var7 + 1));
          auVar3._8_8_ = 0;
          auVar3._0_8_ = in_R8;
          pFVar6 = wasm::ModuleUtils::copyFunction
                             ((ModuleUtils *)pFVar6,(Function *)module,(Module *)0x0,
                              (Name)(auVar3 << 0x40));
        }
        doWalkFunction(this,pFVar6);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::clear(this_00);
    }
    for (; puVar11 !=
           (pointer)intrinsicsModule.globals.
                    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar11 = puVar11 + 1) {
      wasm::ModuleUtils::copyGlobal
                ((Global *)
                 (puVar11->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,module);
    }
    MemoryUtils::ensureExists(module);
    plVar1 = &(this->neededImportedGlobals).List;
    p_Var9 = (_List_node_base *)plVar1;
    while (p_Var9 = (((_List_base<std::pair<wasm::Name,_wasm::Type>,_std::allocator<std::pair<wasm::Name,_wasm::Type>_>_>
                       *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var9 != (_List_node_base *)plVar1) {
      pGVar8 = Module::getGlobalOrNull
                         ((this->
                          super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
                          ).
                          super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
                          .
                          super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
                          .currModule,(Name)p_Var9[1]);
      if (pGVar8 == (Global *)0x0) {
        std::make_unique<wasm::Global>();
        curr._M_head_impl = local_38._M_head_impl;
        p_Var4 = p_Var9[1]._M_prev;
        ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
             (size_t)p_Var9[1]._M_next;
        ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
             (char *)p_Var4;
        ((local_38._M_head_impl)->type).id = (uintptr_t)p_Var9[2]._M_next;
        (local_38._M_head_impl)->mutable_ = false;
        pcVar5 = DAT_00e643a0;
        ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = ENV;
        ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar5;
        p_Var4 = p_Var9[1]._M_prev;
        ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len =
             (size_t)p_Var9[1]._M_next;
        ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)p_Var4;
        local_38._M_head_impl = (Global *)0x0;
        Module::addGlobal(module,curr._M_head_impl);
        std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
                  ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&local_38);
      }
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&input.field_2 + 8));
    SExpressionWasmBuilder::~SExpressionWasmBuilder((SExpressionWasmBuilder *)local_698);
    MixedArena::~MixedArena((MixedArena *)&parser.loc);
    std::__cxx11::string::~string((string *)&parser.root);
    Module::~Module((Module *)&builder.nameMapper.otherIndex);
  }
  return;
}

Assistant:

void doWalkModule(Module* module) {
    // Intrinsics may use scratch memory, ensure it.
    ABI::wasm2js::ensureHelpers(module);

    // Discover all of the intrinsics that we need to inject, lowering all
    // operations to intrinsic calls while we're at it.
    if (!builder) {
      builder = std::make_unique<Builder>(*module);
    }
    PostWalker<RemoveNonJSOpsPass>::doWalkModule(module);

    if (neededIntrinsics.size() == 0) {
      return;
    }

    // Parse the wat blob we have at the end of this file.
    //
    // TODO: only do this once per invocation of wasm2asm
    Module intrinsicsModule;
    std::string input(IntrinsicsModuleWast);
    SExpressionParser parser(const_cast<char*>(input.c_str()));
    Element& root = *parser.root;
    SExpressionWasmBuilder builder(
      intrinsicsModule, *root[0], IRProfile::Normal);

    std::set<Name> neededFunctions;

    // Iteratively link intrinsics from `intrinsicsModule` into our destination
    // module, as needed.
    //
    // Note that intrinsics often use one another. For example the 64-bit
    // division intrinsic ends up using the 32-bit ctz intrinsic, but does so
    // via a native instruction. The loop here is used to continuously reprocess
    // injected intrinsics to ensure that they never contain non-js ops when
    // we're done.
    while (neededIntrinsics.size() > 0) {
      // Recursively probe all needed intrinsics for transitively used
      // functions. This is building up a set of functions we'll link into our
      // module.
      for (auto& name : neededIntrinsics) {
        addNeededFunctions(intrinsicsModule, name, neededFunctions);
      }
      neededIntrinsics.clear();

      // Link in everything that wasn't already linked in. After we've done the
      // copy we then walk the function to rewrite any non-js operations it has
      // as well.
      for (auto& name : neededFunctions) {
        auto* func = module->getFunctionOrNull(name);
        if (!func) {
          func = ModuleUtils::copyFunction(intrinsicsModule.getFunction(name),
                                           *module);
        }
        doWalkFunction(func);
      }
      neededFunctions.clear();
    }

    // Copy all the globals in the intrinsics module
    for (auto& global : intrinsicsModule.globals) {
      ModuleUtils::copyGlobal(global.get(), *module);
    }

    // Intrinsics may use memory, so ensure the module has one.
    MemoryUtils::ensureExists(module);

    // Add missing globals
    for (auto& [name, type] : neededImportedGlobals) {
      if (!getModule()->getGlobalOrNull(name)) {
        auto global = std::make_unique<Global>();
        global->name = name;
        global->type = type;
        global->mutable_ = false;
        global->module = ENV;
        global->base = name;
        module->addGlobal(global.release());
      }
    }
  }